

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp.c
# Opt level: O0

c_int osqp_update_P_A(OSQPWorkspace *work,c_float *Px_new,c_int *Px_new_idx,c_int P_new_n,
                     c_float *Ax_new,c_int *Ax_new_idx,c_int A_new_n)

{
  ulong in_RCX;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  OSQPWorkspace *in_R8;
  long in_R9;
  c_float cVar1;
  c_int nnzA;
  c_int nnzP;
  c_int exitflag;
  c_int i;
  char *in_stack_ffffffffffffffa8;
  ulong uVar2;
  undefined8 in_stack_ffffffffffffffb0;
  OSQPTimer *t;
  long local_40;
  c_int local_8;
  
  if (in_RDI == (long *)0x0) {
    local_8 = _osqp_error((osqp_error_type)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                          in_stack_ffffffffffffffa8);
  }
  else {
    if (in_RDI[0x1d] == 1) {
      in_RDI[0x1d] = 0;
      *(undefined8 *)(in_RDI[0x1a] + 0x60) = 0;
    }
    osqp_tic((OSQPTimer *)0x271dbe);
    t = *(OSQPTimer **)
         (*(long *)(*(long *)(*in_RDI + 0x10) + 0x18) +
         *(long *)(*(long *)(*in_RDI + 0x10) + 0x10) * 8);
    uVar2 = *(ulong *)(*(long *)(*(long *)(*in_RDI + 0x18) + 0x18) +
                      *(long *)(*(long *)(*in_RDI + 0x18) + 0x10) * 8);
    if ((in_RDX == 0) || ((long)in_RCX <= (long)t)) {
      if ((in_R9 == 0) || (nnzP <= (long)uVar2)) {
        if (*(long *)(in_RDI[0x17] + 0x10) != 0) {
          unscale_data((OSQPWorkspace *)0x271ef0);
        }
        if (in_RDX == 0) {
          for (local_40 = 0; local_40 < (long)t; local_40 = local_40 + 1) {
            *(undefined8 *)(*(long *)(*(long *)(*in_RDI + 0x10) + 0x28) + local_40 * 8) =
                 *(undefined8 *)(in_RSI + local_40 * 8);
          }
        }
        else {
          for (local_40 = 0; local_40 < (long)in_RCX; local_40 = local_40 + 1) {
            *(undefined8 *)
             (*(long *)(*(long *)(*in_RDI + 0x10) + 0x28) + *(long *)(in_RDX + local_40 * 8) * 8) =
                 *(undefined8 *)(in_RSI + local_40 * 8);
          }
        }
        if (in_R9 == 0) {
          for (local_40 = 0; local_40 < (long)uVar2; local_40 = local_40 + 1) {
            *(OSQPData **)(*(long *)(*(long *)(*in_RDI + 0x18) + 0x28) + local_40 * 8) =
                 (&in_R8->data)[local_40];
          }
        }
        else {
          for (local_40 = 0; local_40 < nnzP; local_40 = local_40 + 1) {
            *(OSQPData **)
             (*(long *)(*(long *)(*in_RDI + 0x18) + 0x28) + *(long *)(in_R9 + local_40 * 8) * 8) =
                 (&in_R8->data)[local_40];
          }
        }
        if (*(long *)(in_RDI[0x17] + 0x10) != 0) {
          scale_data(in_R8);
        }
        local_8 = (**(code **)(in_RDI[1] + 0x18))
                            (in_RDI[1],*(undefined8 *)(*in_RDI + 0x10),
                             *(undefined8 *)(*in_RDI + 0x18));
        reset_info((OSQPInfo *)0x2720b4);
        if (local_8 < 0) {
          printf("ERROR in %s: ","osqp_update_P_A");
          printf("new KKT matrix is not quasidefinite");
          printf("\n");
        }
        cVar1 = osqp_toc(t);
        *(double *)(in_RDI[0x1a] + 0x60) = cVar1 + *(double *)(in_RDI[0x1a] + 0x60);
      }
      else {
        printf("ERROR in %s: ","osqp_update_P_A");
        printf("new number of elements (%i) greater than elements in A (%i)",nnzP & 0xffffffff,
               uVar2 & 0xffffffff);
        printf("\n");
        local_8 = 2;
      }
    }
    else {
      printf("ERROR in %s: ","osqp_update_P_A");
      printf("new number of elements (%i) greater than elements in P (%i)",in_RCX & 0xffffffff,
             (ulong)t & 0xffffffff);
      printf("\n");
      local_8 = 1;
    }
  }
  return local_8;
}

Assistant:

c_int osqp_update_P_A(OSQPWorkspace *work,
                      const c_float *Px_new,
                      const c_int   *Px_new_idx,
                      c_int          P_new_n,
                      const c_float *Ax_new,
                      const c_int   *Ax_new_idx,
                      c_int          A_new_n) {
  c_int i;          // For indexing
  c_int exitflag;   // Exit flag
  c_int nnzP, nnzA; // Number of nonzeros in P and A

  // Check if workspace has been initialized
  if (!work) return osqp_error(OSQP_WORKSPACE_NOT_INIT_ERROR);

#ifdef PROFILING
  if (work->clear_update_time == 1) {
    work->clear_update_time = 0;
    work->info->update_time = 0.0;
  }
  osqp_tic(work->timer); // Start timer
#endif /* ifdef PROFILING */

  nnzP = work->data->P->p[work->data->P->n];
  nnzA = work->data->A->p[work->data->A->n];


  if (Px_new_idx) { // Passing the index of elements changed
    // Check if number of elements is less or equal than the total number of
    // nonzeros in P
    if (P_new_n > nnzP) {
# ifdef PRINTING
      c_eprint("new number of elements (%i) greater than elements in P (%i)",
               (int)P_new_n,
               (int)nnzP);
# endif /* ifdef PRINTING */
      return 1;
    }
  }


  if (Ax_new_idx) { // Passing the index of elements changed
    // Check if number of elements is less or equal than the total number of
    // nonzeros in A
    if (A_new_n > nnzA) {
# ifdef PRINTING
      c_eprint("new number of elements (%i) greater than elements in A (%i)",
               (int)A_new_n,
               (int)nnzA);
# endif /* ifdef PRINTING */
      return 2;
    }
  }

  if (work->settings->scaling) {
    // Unscale data
    unscale_data(work);
  }

  // Update P elements
  if (Px_new_idx) { // Change only Px_new_idx
    for (i = 0; i < P_new_n; i++) {
      work->data->P->x[Px_new_idx[i]] = Px_new[i];
    }
  }
  else // Change whole P
  {
    for (i = 0; i < nnzP; i++) {
      work->data->P->x[i] = Px_new[i];
    }
  }

  // Update A elements
  if (Ax_new_idx) { // Change only Ax_new_idx
    for (i = 0; i < A_new_n; i++) {
      work->data->A->x[Ax_new_idx[i]] = Ax_new[i];
    }
  }
  else { // Change whole A
    for (i = 0; i < nnzA; i++) {
      work->data->A->x[i] = Ax_new[i];
    }
  }

  if (work->settings->scaling) {
    // Scale data
    scale_data(work);
  }

  // Update linear system structure with new data
  exitflag = work->linsys_solver->update_matrices(work->linsys_solver,
                                                  work->data->P,
                                                  work->data->A);

  // Reset solver information
  reset_info(work->info);

# ifdef PRINTING

  if (exitflag < 0) {
    c_eprint("new KKT matrix is not quasidefinite");
  }
# endif /* ifdef PRINTING */

#ifdef PROFILING
  work->info->update_time += osqp_toc(work->timer);
#endif /* ifdef PROFILING */

  return exitflag;
}